

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_info.cpp
# Opt level: O1

RegSet * __thiscall
mocker::LoopInfo::findLoopInvariantVariables
          (RegSet *__return_storage_ptr__,LoopInfo *this,FunctionModule *func,size_t header,
          UseDefChain *useDef,FuncAttr *funcAttr)

{
  _List_node_base *inst;
  _Hash_node_base *p_Var1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  pointer psVar6;
  bool bVar7;
  int iVar8;
  BasicBlock *pBVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  __node_base_ptr p_Var13;
  ulong uVar14;
  element_type *peVar15;
  __node_base_ptr p_Var16;
  _List_node_base *p_Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  pointer addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var19;
  bool bVar20;
  char cVar21;
  bool bVar22;
  shared_ptr<mocker::ir::Reg> dest;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  long local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Hash_node_base *local_70;
  mapped_type *local_68;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_60;
  _List_node_base *local_58;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_50;
  size_t local_38;
  
  local_60 = (_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)useDef;
  local_38 = header;
  local_68 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this,&local_38);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_70 = (local_68->_M_h)._M_before_begin._M_nxt;
  if (local_70 != (_Hash_node_base *)0x0) {
    do {
      pBVar9 = ir::FunctionModule::getBasicBlock(func,(size_t)local_70[1]._M_nxt);
      local_58 = (_List_node_base *)&pBVar9->insts;
      p_Var19 = (pBVar9->insts).
                super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var19 != local_58) {
        do {
          p_Var17 = p_Var19[1]._M_next;
          if (*(int *)&p_Var17->_M_prev == 3) {
            p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[1]._M_prev;
            if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
              }
            }
          }
          else {
            p_Var17 = (_List_node_base *)0x0;
            p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          inst = p_Var19 + 1;
          bVar20 = true;
          if (p_Var17 == (_List_node_base *)0x0) {
            peVar15 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                      &inst->_M_next)->_M_ptr;
            if (peVar15->type == ArithUnaryInst) {
              local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[1]._M_prev;
              if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_b8->_M_use_count = local_b8->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_b8->_M_use_count = local_b8->_M_use_count + 1;
                }
              }
            }
            else {
              peVar15 = (element_type *)0x0;
              local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if (peVar15 != (element_type *)0x0) goto LAB_0015a0a6;
            peVar15 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                      &inst->_M_next)->_M_ptr;
            if (peVar15->type == ArithBinaryInst) {
              local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[1]._M_prev;
              if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_c0->_M_use_count = local_c0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_c0->_M_use_count = local_c0->_M_use_count + 1;
                }
              }
            }
            else {
              peVar15 = (element_type *)0x0;
              local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if (peVar15 == (element_type *)0x0) {
              peVar15 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                        &inst->_M_next)->_M_ptr;
              if (peVar15->type == RelationInst) {
                local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[1]._M_prev;
                if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_c8->_M_use_count = local_c8->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_c8->_M_use_count = local_c8->_M_use_count + 1;
                  }
                }
              }
              else {
                peVar15 = (element_type *)0x0;
                local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              if (peVar15 != (element_type *)0x0) {
                bVar7 = false;
                goto LAB_0015a458;
              }
              peVar15 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                        &inst->_M_next)->_M_ptr;
              if (peVar15->type == Call) {
                local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[1]._M_prev;
                if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_d0->_M_use_count = local_d0->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_d0->_M_use_count = local_d0->_M_use_count + 1;
                  }
                }
              }
              else {
                peVar15 = (element_type *)0x0;
                local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              bVar22 = peVar15 == (element_type *)0x0;
              bVar5 = false;
              bVar7 = false;
              bVar20 = false;
            }
            else {
              bVar7 = true;
LAB_0015a458:
              bVar5 = false;
              bVar22 = false;
            }
          }
          else {
LAB_0015a0a6:
            bVar22 = false;
            bVar5 = true;
            bVar7 = true;
          }
          if ((!bVar20) && (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
          }
          if (!bVar7 && local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
          }
          if (!bVar5 && local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
          if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
              p_Var17 == (_List_node_base *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
          }
          if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
          }
          if (!bVar22) {
            peVar15 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                      &inst->_M_next)->_M_ptr;
            if (peVar15->type == Call) {
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[1]._M_prev;
              if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                }
              }
            }
            else {
              peVar15 = (element_type *)0x0;
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if ((peVar15 == (element_type *)0x0) ||
               (cVar10 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(&(funcAttr->pureFuncs)._M_h,(key_type *)&peVar15[2].type),
               cVar10.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur != (__node_type *)0x0)) {
              if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
              }
              ir::getDest((ir *)&local_90,(shared_ptr<mocker::ir::IRInst> *)inst);
              p_Var18 = local_88;
              if (local_90 != 0) {
                ir::getOperandsUsed(&local_50,(shared_ptr<mocker::ir::IRInst> *)inst);
                psVar6 = local_50.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                bVar20 = local_50.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                         local_50.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (!bVar20) {
                  bVar20 = false;
                  addr = local_50.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    ir::dycLocalReg((ir *)&local_80,addr);
                    cVar21 = '\x03';
                    if ((((local_80 != 0) &&
                         (bVar7 = isParameter(func,(string *)(local_80 + 8)), !bVar7)) &&
                        (iVar8 = std::__cxx11::string::compare((char *)(local_80 + 8)), iVar8 != 0))
                       && (cVar11 = std::
                                    _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                    ::find(&__return_storage_ptr__->_M_h,(key_type *)&local_80),
                          cVar11.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>.
                          _M_cur == (__node_type *)0x0)) {
                      cVar12 = std::
                               _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               ::find(local_60,(key_type *)&local_80);
                      if (cVar12.
                          super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                          ._M_cur == (__node_type *)0x0) {
                        std::__throw_out_of_range("_Map_base::at");
                      }
                      p_Var1 = *(_Hash_node_base **)
                                ((long)cVar12.
                                       super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                                       ._M_cur + 0x18);
                      uVar2 = (local_68->_M_h)._M_bucket_count;
                      uVar14 = (ulong)p_Var1 % uVar2;
                      p_Var3 = (local_68->_M_h)._M_buckets[uVar14];
                      p_Var13 = (__node_base_ptr)0x0;
                      if ((p_Var3 != (__node_base_ptr)0x0) &&
                         (p_Var13 = p_Var3, p_Var16 = p_Var3->_M_nxt,
                         p_Var1 != p_Var3->_M_nxt[1]._M_nxt)) {
                        while (p_Var4 = p_Var16->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
                          p_Var13 = (__node_base_ptr)0x0;
                          if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar14) ||
                             (p_Var13 = p_Var16, p_Var16 = p_Var4, p_Var1 == p_Var4[1]._M_nxt))
                          goto LAB_0015a2ac;
                        }
                        p_Var13 = (__node_base_ptr)0x0;
                      }
LAB_0015a2ac:
                      cVar21 = '\0';
                      if (p_Var13 != (__node_base_ptr)0x0) {
                        cVar21 = p_Var13->_M_nxt != (_Hash_node_base *)0x0;
                      }
                    }
                    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
                    }
                    if ((cVar21 != '\x03') && (cVar21 != '\0')) break;
                    addr = addr + 1;
                    bVar20 = addr == psVar6;
                  } while (!bVar20);
                }
                std::
                vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ::~vector(&local_50);
                p_Var18 = local_88;
                if (bVar20) {
                  peVar15 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                            &inst->_M_next)->_M_ptr;
                  if (peVar15->type == Call) {
                    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var19[1]._M_prev;
                    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        this_00->_M_use_count = this_00->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        this_00->_M_use_count = this_00->_M_use_count + 1;
                      }
                    }
                  }
                  else {
                    peVar15 = (element_type *)0x0;
                    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  }
                  if ((peVar15 == (element_type *)0x0) ||
                     (cVar10 = std::
                               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               ::find(&(funcAttr->pureFuncs)._M_h,(key_type *)&peVar15[2].type),
                     cVar10.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur != (__node_type *)0x0)) {
                    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                    }
                    std::
                    _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    ::_M_emplace<std::shared_ptr<mocker::ir::Reg>&>
                              ((_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                *)__return_storage_ptr__,&local_90);
                    p_Var18 = local_88;
                  }
                  else {
                    p_Var18 = local_88;
                    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                      p_Var18 = local_88;
                    }
                  }
                }
              }
            }
            if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
            }
          }
          p_Var19 = p_Var19->_M_next;
        } while (p_Var19 != local_58);
      }
      local_70 = local_70->_M_nxt;
    } while (local_70 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ir::RegSet LoopInfo::findLoopInvariantVariables(const ir::FunctionModule &func,
                                                std::size_t header,
                                                const UseDefChain &useDef,
                                                const FuncAttr &funcAttr) {
  const auto &loopNodes = getLoops().at(header);

  ir::RegSet res;

  auto isLoopInvariant = [&res, &loopNodes, &useDef,
                          &func](const std::shared_ptr<ir::IRInst> &inst) {
    auto operands = ir::getOperandsUsed(inst);
    for (auto &operand : operands) {
      auto reg = ir::dycLocalReg(operand);
      if (!reg) {
        continue;
      }
      if (isParameter(func, reg->getIdentifier()) ||
          reg->getIdentifier() == ".phi_nan")
        continue;
      if (isIn(res, reg))
        continue;

      const auto &def = useDef.getDef(reg);
      if (isIn(loopNodes, def.getBBLabel())) {
        return false;
      }
    }
    return true;
  };

  for (auto node : loopNodes) {
    const auto &bb = func.getBasicBlock(node);
    for (auto &inst : bb.getInsts()) {
      if (!ir::dyc<ir::Assign>(inst) && !ir::dyc<ir::ArithUnaryInst>(inst) &&
          !ir::dyc<ir::ArithBinaryInst>(inst) &&
          !ir::dyc<ir::RelationInst>(inst) && !ir::dyc<ir::Call>(inst))
        continue;
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (!funcAttr.isPure(call->getFuncName()))
          continue;
      }
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      if (!isLoopInvariant(inst))
        continue;
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (!funcAttr.isPure(call->getFuncName()))
          continue;
      }
      res.emplace(dest);
    }
  }

  return res;
}